

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O1

Z80Cond Z80::getz80cond(char **p)

{
  char *pcVar1;
  byte bVar2;
  Z80Cond ZVar3;
  int iVar4;
  byte bVar5;
  
  pcVar1 = lp;
  if (Options::IsLR35902 != '\0') {
    ZVar3 = getz80cond_Z80(p);
    if (3 < (ZVar3 << 0x1d | ZVar3 >> 3)) {
      ZVar3 = Z80C_UNK;
      lp = pcVar1;
    }
    return ZVar3;
  }
  iVar4 = SkipBlanks(&lp);
  pcVar1 = lp;
  if (iVar4 != 0) {
    return Z80C_UNK;
  }
  bVar5 = *lp | 0x20;
  iVar4 = islabchar(lp[1]);
  if (iVar4 == 0) {
    lp = lp + 1;
    if (bVar5 < 0x70) {
      if (bVar5 == 99) {
        return Z80C_C;
      }
      if (bVar5 == 0x6d) {
        return Z80C_M;
      }
    }
    else {
      if (bVar5 == 0x70) {
        return Z80C_P;
      }
      if (bVar5 == 0x73) {
        return Z80C_M;
      }
      if (bVar5 == 0x7a) {
        return Z80C_Z;
      }
    }
  }
  else {
    if (((lp[1] ^ *lp) & 0x20U) != 0) {
      return Z80C_UNK;
    }
    iVar4 = islabchar(lp[2]);
    if (iVar4 != 0) {
      return Z80C_UNK;
    }
    bVar2 = lp[1] | 0x20;
    lp = lp + 2;
    if (bVar5 == 0x70) {
      if (bVar2 == 0x6f) {
        return Z80C_PO;
      }
      if (bVar2 == 0x65) {
        return Z80C_PE;
      }
    }
    else if (bVar5 == 0x6e) {
      if (bVar2 == 0x7a) {
        return Z80C_NZ;
      }
      if (bVar2 == 0x73) {
        return Z80C_P;
      }
      if (bVar2 == 99) {
        return Z80C_NC;
      }
    }
  }
  lp = pcVar1;
  return Z80C_UNK;
}

Assistant:

static Z80Cond getz80cond(char*& p) {
		if (!Options::IsLR35902) return getz80cond_Z80(p);
		// Sharp LR35902 has only nz|z|nc|c condition variants of ret|jp|jr|call
		char * const pp = p;
		Z80Cond cc = getz80cond_Z80(p);
		switch (cc) {
		case Z80C_NZ:	case Z80C_Z:
		case Z80C_NC:	case Z80C_C:
			return cc;
		default:
			p = pp;			// restore source ptr
			return Z80C_UNK;
		}
	}